

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase2VS::Run(BasicStdLayoutBase2VS *this)

{
  CallLogWrapper *this_00;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  size_t i;
  pointer *ppuVar5;
  ulong uVar6;
  uint index;
  byte bVar7;
  long lVar8;
  long lVar9;
  allocator<char> local_ea;
  allocator<char> local_e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  string local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [4];
  
  bVar2 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,8)
  ;
  if (bVar2) {
    in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    in_data[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    in_data[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    in_data[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar3 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&out_data,(char *)CONCAT44(extraout_var,iVar3),&local_e9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,glcts::fixed_sample_locations_values + 1,&local_ea);
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)&out_data,&local_b8);
    this->m_program = GVar4;
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&out_data);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar2) {
      glu::CallLogWrapper::glGenBuffers(this_00,8,this->m_buffer);
      ppuVar5 = &in_data[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      index = 0;
      for (lVar8 = -4; lVar8 != 0; lVar8 = lVar8 + 1) {
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,index,this->m_buffer[lVar8 + 4]);
        glu::CallLogWrapper::glBufferData
                  (this_00,0x90d2,
                   (long)*ppuVar5 - (long)((_Vector_impl_data *)(ppuVar5 + -1))->_M_start,
                   ((_Vector_impl_data *)(ppuVar5 + -1))->_M_start,0x88e4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (long)*ppuVar5 - (long)((_Vector_impl_data *)(ppuVar5 + -1))->_M_start,
                   (allocator_type *)&local_b8);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,index | 4,this->m_buffer[lVar8 + 8]);
        glu::CallLogWrapper::glBufferData
                  (this_00,0x90d2,
                   (long)*ppuVar5 - (long)((_Vector_impl_data *)(ppuVar5 + -1))->_M_start,
                   out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,0x88e4);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        index = index + 1;
        ppuVar5 = ppuVar5 + 3;
      }
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      bVar7 = 1;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&out_data,
                   (long)in_data[lVar8].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)in_data[lVar8].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(allocator_type *)&local_b8);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer[lVar8 + 4]);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        glu::CallLogWrapper::glGetBufferSubData
                  (this_00,0x90d2,0,
                   (long)in_data[lVar8].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)in_data[lVar8].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                   out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        for (uVar6 = 0;
            puVar1 = in_data[lVar8].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar6 < (ulong)((long)in_data[lVar8].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
            uVar6 = uVar6 + 1) {
          if (puVar1[uVar6] !=
              out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6]) {
            bVar7 = 0;
            anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n",uVar6 & 0xffffffff);
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      lVar8 = -(ulong)(~bVar7 & 1);
    }
    else {
      lVar8 = -1;
    }
    lVar9 = 0x48;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&in_data[0].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar9));
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != -0x18);
  }
  else {
    lVar8 = 0x10;
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(8))
			return NOT_SUPPORTED;
		std::vector<GLubyte> in_data[4];
		const char*			 glsl_vs = GetInput(in_data);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(8, m_buffer);

		for (GLuint i = 0; i < 4; ++i)
		{
			// input buffers
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &in_data[i][0], GL_STATIC_DRAW);

			// output buffers
			std::vector<GLubyte> out_data(in_data[i].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 4, m_buffer[i + 4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		bool status = true;
		for (int j = 0; j < 4; ++j)
		{
			std::vector<GLubyte> out_data(in_data[j].size());
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 4]);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), &out_data[0]);

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}